

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCylindricalShellShape.cpp
# Opt level: O1

cbtVector3 __thiscall
cbtCylindricalShellShape::localGetSupportingVertexWithoutMargin
          (cbtCylindricalShellShape *this,cbtVector3 *vec)

{
  cbtScalar cVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  float fVar5;
  ulong uVar7;
  float fVar6;
  undefined1 auVar8 [16];
  cbtVector3 cVar9;
  
  fVar6 = (this->super_cbtConvexInternalShape).m_implicitShapeDimensions.m_floats[0];
  cVar1 = (this->super_cbtConvexInternalShape).m_implicitShapeDimensions.m_floats[1];
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(vec->m_floats[2] * vec->m_floats[2])),
                           ZEXT416((uint)vec->m_floats[0]),ZEXT416((uint)vec->m_floats[0]));
  auVar8 = ZEXT816(0);
  if (auVar4._0_4_ < 0.0) {
    fVar5 = sqrtf(auVar4._0_4_);
    auVar8 = ZEXT816(0) << 0x40;
  }
  else {
    auVar4 = vsqrtss_avx(auVar4,auVar4);
    fVar5 = auVar4._0_4_;
  }
  if ((fVar5 != 0.0) || (NAN(fVar5))) {
    fVar6 = fVar6 / fVar5;
    auVar8._8_4_ = 0x80000000;
    auVar8._0_8_ = 0x8000000080000000;
    auVar8._12_4_ = 0x80000000;
    auVar4 = vxorps_avx512vl(ZEXT416((uint)cVar1),auVar8);
    uVar2 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)vec->m_floats[1]),0xe);
    bVar3 = (bool)((byte)uVar2 & 1);
    auVar4 = vinsertps_avx(ZEXT416((uint)(fVar6 * vec->m_floats[0])),
                           ZEXT416((uint)bVar3 * auVar4._0_4_ + (uint)!bVar3 * (int)cVar1),0x10);
    uVar2 = auVar4._0_8_;
    uVar7 = (ulong)(uint)(fVar6 * vec->m_floats[2]);
  }
  else {
    auVar4._8_4_ = 0x80000000;
    auVar4._0_8_ = 0x8000000080000000;
    auVar4._12_4_ = 0x80000000;
    auVar4 = vxorps_avx512vl(ZEXT416((uint)cVar1),auVar4);
    uVar2 = vcmpss_avx512f(auVar8,ZEXT416((uint)vec->m_floats[1]),0xe);
    bVar3 = (bool)((byte)uVar2 & 1);
    auVar4 = vinsertps_avx(ZEXT416((uint)fVar6),
                           ZEXT416((uint)bVar3 * auVar4._0_4_ + (uint)!bVar3 * (int)cVar1),0x10);
    uVar2 = auVar4._0_8_;
    uVar7 = 0;
  }
  cVar9.m_floats[2] = (cbtScalar)(int)uVar7;
  cVar9.m_floats[3] = (cbtScalar)(int)(uVar7 >> 0x20);
  cVar9.m_floats[0] = (cbtScalar)(int)uVar2;
  cVar9.m_floats[1] = (cbtScalar)(int)((ulong)uVar2 >> 0x20);
  return (cbtVector3)cVar9.m_floats;
}

Assistant:

cbtVector3 cbtCylindricalShellShape::localGetSupportingVertexWithoutMargin(const cbtVector3& vec) const {
    return CylShellLocalSupport(getHalfExtentsWithoutMargin(), vec);
}